

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

PipelineCacheWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreatePipelineCache
          (PipelineCacheWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkPipelineCacheCreateInfo *CI,char *DebugName)

{
  string msg;
  string local_48;
  
  if (CI->sType != VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[57]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CI.sType == VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO",
               (char (*) [57])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreatePipelineCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x1b6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  CreateVulkanObject<VkPipelineCache_T*,(VulkanUtilities::VulkanHandleTypeId)22,VkResult(*)(VkDevice_T*,VkPipelineCacheCreateInfo_const*,VkAllocationCallbacks_const*,VkPipelineCache_T**),VkPipelineCacheCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkPipelineCacheCreateInfo_ptr_VkAllocationCallbacks_ptr_VkPipelineCache_T_ptr_ptr
              *)vkCreatePipelineCache,CI,DebugName,"pipeline cache");
  return __return_storage_ptr__;
}

Assistant:

PipelineCacheWrapper VulkanLogicalDevice::CreatePipelineCache(const VkPipelineCacheCreateInfo& CI, const char* DebugName) const
{
    VERIFY_EXPR(CI.sType == VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO);
    return CreateVulkanObject<VkPipelineCache, VulkanHandleTypeId::PipelineCache>(vkCreatePipelineCache, CI, DebugName, "pipeline cache");
}